

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall GlobOpt::TrackTempObjectSyms(GlobOpt *this,Instr *instr,RegOpnd *opnd)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  uint32 offset;
  int iVar4;
  undefined4 *puVar5;
  RegOpnd *pRVar6;
  JitArenaAllocator *pJVar7;
  BVSparse<Memory::JitArenaAllocator> *pBVar8;
  Opnd *pOVar9;
  JITTimeFunctionBody *this_00;
  BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  bool local_142;
  bool local_141;
  bool local_132;
  bool local_131;
  bool local_121;
  bool local_113;
  bool local_112;
  bool local_111;
  TrackAllocData local_f8;
  undefined1 local_d0 [8];
  StackLiteralInitFldData data;
  TrackAllocData local_b0;
  PropertyIdArray *local_88;
  PropertyIdArray *propIds;
  IntConstOpnd *propertyArrayIdOpnd;
  undefined8 local_70;
  TrackAllocData local_68;
  SymID local_3c;
  StackSym *pSStack_38;
  SymID symId;
  StackSym *sym;
  bool maybeTemp;
  GlobOptBlockData *pGStack_28;
  bool canStoreTemp;
  GlobOptBlockData *globOptData;
  RegOpnd *opnd_local;
  Instr *instr_local;
  GlobOpt *this_local;
  
  globOptData = (GlobOptBlockData *)opnd;
  opnd_local = (RegOpnd *)instr;
  instr_local = (Instr *)this;
  if (((*(ushort *)&instr->field_0x36 >> 3 & 1) != 0) &&
     (bVar2 = ObjectTempVerify::CanMarkTemp(instr,(BackwardPass *)0x0), !bVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x41b4,
                       "(!instr->dstIsTempObject || ObjectTempVerify::CanMarkTemp(instr, nullptr))",
                       "!instr->dstIsTempObject || ObjectTempVerify::CanMarkTemp(instr, nullptr)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pGStack_28 = CurrentBlockData(this);
  sym._7_1_ = 0;
  sym._6_1_ = 0;
  bVar2 = OpCodeAttr::TempObjectProducing(*(OpCode *)&opnd_local[1].m_sym);
  if (bVar2) {
    sym._6_1_ = (byte)(*(ushort *)((long)&opnd_local[1].m_sym + 6) >> 3) & 1;
    local_111 = false;
    if ((*(ushort *)((long)&opnd_local[1].m_sym + 6) >> 3 & 1) != 0) {
      local_111 = ObjectTemp::CanStoreTemp((Instr *)opnd_local);
    }
    sym._7_1_ = local_111;
    goto LAB_005b2946;
  }
  bVar2 = OpCodeAttr::TempObjectTransfer(*(OpCode *)&opnd_local[1].m_sym);
  if (!bVar2) goto LAB_005b2946;
  local_112 = false;
  if (pGStack_28->maybeTempObjectSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    pOVar9 = IR::Instr::GetSrc1((Instr *)opnd_local);
    bVar2 = IR::Opnd::IsRegOpnd(pOVar9);
    if (bVar2) {
      pBVar8 = pGStack_28->maybeTempObjectSyms;
      pOVar9 = IR::Instr::GetSrc1((Instr *)opnd_local);
      pRVar6 = IR::Opnd::AsRegOpnd(pOVar9);
      BVar3 = BVSparse<Memory::JitArenaAllocator>::Test(pBVar8,(pRVar6->m_sym->super_Sym).m_id);
      local_113 = true;
      if (BVar3 == '\0') goto LAB_005b265e;
    }
    else {
LAB_005b265e:
      pOVar9 = IR::Instr::GetSrc2((Instr *)opnd_local);
      local_121 = false;
      if (pOVar9 != (Opnd *)0x0) {
        pOVar9 = IR::Instr::GetSrc2((Instr *)opnd_local);
        bVar2 = IR::Opnd::IsRegOpnd(pOVar9);
        local_121 = false;
        if (bVar2) {
          pBVar8 = pGStack_28->maybeTempObjectSyms;
          pOVar9 = IR::Instr::GetSrc2((Instr *)opnd_local);
          pRVar6 = IR::Opnd::AsRegOpnd(pOVar9);
          BVar3 = BVSparse<Memory::JitArenaAllocator>::Test(pBVar8,(pRVar6->m_sym->super_Sym).m_id);
          local_121 = BVar3 != '\0';
        }
      }
      local_113 = local_121;
    }
    local_112 = local_113;
  }
  sym._6_1_ = local_112;
  local_131 = false;
  if (pGStack_28->canStoreTempObjectSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    pOVar9 = IR::Instr::GetSrc1((Instr *)opnd_local);
    bVar2 = IR::Opnd::IsRegOpnd(pOVar9);
    local_132 = false;
    if (bVar2) {
      pBVar8 = pGStack_28->canStoreTempObjectSyms;
      pOVar9 = IR::Instr::GetSrc1((Instr *)opnd_local);
      pRVar6 = IR::Opnd::AsRegOpnd(pOVar9);
      BVar3 = BVSparse<Memory::JitArenaAllocator>::Test(pBVar8,(pRVar6->m_sym->super_Sym).m_id);
      local_132 = false;
      if (BVar3 != '\0') {
        pOVar9 = IR::Instr::GetSrc2((Instr *)opnd_local);
        local_141 = true;
        if (pOVar9 != (Opnd *)0x0) {
          pOVar9 = IR::Instr::GetSrc2((Instr *)opnd_local);
          bVar2 = IR::Opnd::IsRegOpnd(pOVar9);
          local_142 = false;
          if (bVar2) {
            pBVar8 = pGStack_28->canStoreTempObjectSyms;
            pOVar9 = IR::Instr::GetSrc2((Instr *)opnd_local);
            pRVar6 = IR::Opnd::AsRegOpnd(pOVar9);
            BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                              (pBVar8,(pRVar6->m_sym->super_Sym).m_id);
            local_142 = BVar3 != '\0';
          }
          local_141 = local_142;
        }
        local_132 = local_141;
      }
    }
    local_131 = local_132;
  }
  sym._7_1_ = local_131;
  if ((local_131 != false) && ((*(ushort *)((long)&opnd_local[1].m_sym + 6) >> 3 & 1) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x41cd,"(!canStoreTemp || instr->dstIsTempObject)",
                       "!canStoreTemp || instr->dstIsTempObject");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (((sym._6_1_ & 1) != 0) && ((*(ushort *)((long)&opnd_local[1].m_sym + 6) >> 3 & 1) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x41ce,"(!maybeTemp || instr->dstIsTempObject)",
                       "!maybeTemp || instr->dstIsTempObject");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
LAB_005b2946:
  pSStack_38 = (StackSym *)globOptData->liveFields;
  bVar2 = StackSym::IsVar(pSStack_38);
  if ((bVar2) ||
     (pSStack_38 = StackSym::GetVarEquivSym(pSStack_38,(Func *)0x0), pSStack_38 != (StackSym *)0x0))
  {
    local_3c = (pSStack_38->super_Sym).m_id;
    if ((sym._6_1_ & 1) == 0) {
      if ((sym._7_1_ & 1) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x4213,"(!canStoreTemp)","!canStoreTemp");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      if (pGStack_28->maybeTempObjectSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        if (pGStack_28->canStoreTempObjectSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x421e,"(!globOptData.canStoreTempObjectSyms)",
                             "!globOptData.canStoreTempObjectSyms");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
      }
      else {
        if (pGStack_28->canStoreTempObjectSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          BVSparse<Memory::JitArenaAllocator>::Clear(pGStack_28->canStoreTempObjectSyms,local_3c);
        }
        BVSparse<Memory::JitArenaAllocator>::Clear(pGStack_28->maybeTempObjectSyms,local_3c);
      }
      bVar2 = IsLoopPrePass(this);
      if ((((!bVar2) &&
           (pGStack_28->stackLiteralInitFldDataMap != (StackLiteralInitFldDataMap *)0x0)) &&
          (iVar4 = JsUtil::
                   BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                   ::Count(pGStack_28->stackLiteralInitFldDataMap), iVar4 != 0)) &&
         (bVar2 = JsUtil::
                  BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  ::ContainsKey(pGStack_28->stackLiteralInitFldDataMap,&stack0xffffffffffffffc8),
         bVar2)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x4225,
                           "(this->IsLoopPrePass() || globOptData.stackLiteralInitFldDataMap == nullptr || globOptData.stackLiteralInitFldDataMap->Count() == 0 || !globOptData.stackLiteralInitFldDataMap->ContainsKey(sym))"
                           ,
                           "this->IsLoopPrePass() || globOptData.stackLiteralInitFldDataMap == nullptr || globOptData.stackLiteralInitFldDataMap->Count() == 0 || !globOptData.stackLiteralInitFldDataMap->ContainsKey(sym)"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
    }
    else {
      if ((StackSym *)globOptData->liveFields != pSStack_38) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x41e0,"(opnd->m_sym == sym)","opnd->m_sym == sym");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      if (pGStack_28->maybeTempObjectSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        pJVar7 = this->alloc;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_68,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
                   0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                   ,0x41e4);
        pJVar7 = (JitArenaAllocator *)
                 Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                 *)pJVar7,&local_68);
        propertyArrayIdOpnd = (IntConstOpnd *)Memory::JitArenaAllocator::Alloc;
        local_70 = 0;
        pBVar8 = (BVSparse<Memory::JitArenaAllocator> *)
                 new<Memory::JitArenaAllocator>(0x20,pJVar7,0x4e98c0);
        BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar8,this->alloc);
        pGStack_28->maybeTempObjectSyms = pBVar8;
      }
      BVSparse<Memory::JitArenaAllocator>::Set(pGStack_28->maybeTempObjectSyms,local_3c);
      if ((sym._7_1_ & 1) == 0) {
        if (pGStack_28->canStoreTempObjectSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          BVSparse<Memory::JitArenaAllocator>::Clear(pGStack_28->canStoreTempObjectSyms,local_3c);
        }
      }
      else {
        if ((*(short *)&opnd_local[1].m_sym == 0xce) && (bVar2 = IsLoopPrePass(this), !bVar2)) {
          pOVar9 = IR::Instr::GetSrc1((Instr *)opnd_local);
          propIds = (PropertyIdArray *)IR::Opnd::AsIntConstOpnd(pOVar9);
          this_00 = Func::GetJITFunctionBody((Func *)opnd_local[1].super_Opnd._vptr_Opnd);
          offset = IR::IntConstOpnd::AsUint32((IntConstOpnd *)propIds);
          local_88 = JITTimeFunctionBody::ReadPropertyIdArrayFromAuxData(this_00,offset);
          if ((local_88->hadDuplicates & 1U) != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x41f8,"(!propIds->hadDuplicates)","!propIds->hadDuplicates");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
          if (pGStack_28->stackLiteralInitFldDataMap == (StackLiteralInitFldDataMap *)0x0) {
            pJVar7 = this->alloc;
            Memory::TrackAllocData::CreateTrackAllocData
                      (&local_b0,
                       (type_info *)
                       &JsUtil::
                        BaseDictionary<StackSym*,StackLiteralInitFldData,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        ::typeinfo,0,0xffffffffffffffff,
                       "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x41fc);
            pJVar7 = (JitArenaAllocator *)
                     Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                     TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                     *)pJVar7,&local_b0);
            data._8_8_ = Memory::JitArenaAllocator::Alloc;
            this_01 = (BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                       *)new<Memory::JitArenaAllocator>(0x38,pJVar7,0x4e98c0);
            JsUtil::
            BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::BaseDictionary(this_01,this->alloc,0);
            pGStack_28->stackLiteralInitFldDataMap = this_01;
          }
          else {
            bVar2 = JsUtil::
                    BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    ::ContainsKey(pGStack_28->stackLiteralInitFldDataMap,&stack0xffffffffffffffc8);
            if (bVar2) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar5 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                 ,0x4200,
                                 "(!globOptData.stackLiteralInitFldDataMap->ContainsKey(sym))",
                                 "!globOptData.stackLiteralInitFldDataMap->ContainsKey(sym)");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar5 = 0;
            }
          }
          local_d0 = (undefined1  [8])local_88;
          data.propIds._0_4_ = 0;
          JsUtil::
          BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::AddNew(pGStack_28->stackLiteralInitFldDataMap,&stack0xffffffffffffffc8,
                   (StackLiteralInitFldData *)local_d0);
        }
        if (pGStack_28->canStoreTempObjectSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          pJVar7 = this->alloc;
          Memory::TrackAllocData::CreateTrackAllocData
                    (&local_f8,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
                     0xffffffffffffffff,
                     "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                     ,0x4208);
          pJVar7 = (JitArenaAllocator *)
                   Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                   TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                   *)pJVar7,&local_f8);
          pBVar8 = (BVSparse<Memory::JitArenaAllocator> *)
                   new<Memory::JitArenaAllocator>(0x20,pJVar7,0x4e98c0);
          BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar8,this->alloc);
          pGStack_28->canStoreTempObjectSyms = pBVar8;
        }
        BVSparse<Memory::JitArenaAllocator>::Set(pGStack_28->canStoreTempObjectSyms,local_3c);
      }
    }
  }
  return;
}

Assistant:

void
GlobOpt::TrackTempObjectSyms(IR::Instr * instr, IR::RegOpnd * opnd)
{
    // If it is marked as dstIsTempObject, we should have mark temped it, or type specialized it to Ld_I4.
    Assert(!instr->dstIsTempObject || ObjectTempVerify::CanMarkTemp(instr, nullptr));
    GlobOptBlockData& globOptData = *CurrentBlockData();
    bool canStoreTemp = false;
    bool maybeTemp = false;
    if (OpCodeAttr::TempObjectProducing(instr->m_opcode))
    {
        maybeTemp = instr->dstIsTempObject;

        // We have to make sure that lower will always generate code to do stack allocation
        // before we can store any other stack instance onto it. Otherwise, we would not
        // walk object to box the stack property.
        canStoreTemp = instr->dstIsTempObject && ObjectTemp::CanStoreTemp(instr);
    }
    else if (OpCodeAttr::TempObjectTransfer(instr->m_opcode))
    {
        // Need to check both sources, GetNewScObject has two srcs for transfer.
        // No need to get var equiv sym here as transfer of type spec value does not transfer a mark temp object.
        maybeTemp = globOptData.maybeTempObjectSyms && (
            (instr->GetSrc1()->IsRegOpnd() && globOptData.maybeTempObjectSyms->Test(instr->GetSrc1()->AsRegOpnd()->m_sym->m_id))
            || (instr->GetSrc2() && instr->GetSrc2()->IsRegOpnd() && globOptData.maybeTempObjectSyms->Test(instr->GetSrc2()->AsRegOpnd()->m_sym->m_id)));

        canStoreTemp = globOptData.canStoreTempObjectSyms && (
            (instr->GetSrc1()->IsRegOpnd() && globOptData.canStoreTempObjectSyms->Test(instr->GetSrc1()->AsRegOpnd()->m_sym->m_id))
            && (!instr->GetSrc2() || (instr->GetSrc2()->IsRegOpnd() && globOptData.canStoreTempObjectSyms->Test(instr->GetSrc2()->AsRegOpnd()->m_sym->m_id))));

        AssertOrFailFast(!canStoreTemp || instr->dstIsTempObject);
        AssertOrFailFast(!maybeTemp || instr->dstIsTempObject);
    }

    // Need to get the var equiv sym as assignment of type specialized sym kill the var sym value anyway.
    StackSym * sym = opnd->m_sym;
    if (!sym->IsVar())
    {
        sym = sym->GetVarEquivSym(nullptr);
        if (sym == nullptr)
        {
            return;
        }
    }

    SymID symId = sym->m_id;
    if (maybeTemp)
    {
        // Only var sym should be temp objects
        Assert(opnd->m_sym == sym);

        if (globOptData.maybeTempObjectSyms == nullptr)
        {
            globOptData.maybeTempObjectSyms = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
        }
        globOptData.maybeTempObjectSyms->Set(symId);

        if (canStoreTemp)
        {
            if (instr->m_opcode == Js::OpCode::NewScObjectLiteral && !this->IsLoopPrePass())
            {
                // For object literal, we install the final type up front.
                // If there are bailout before we finish initializing all the fields, we need to
                // zero out the rest if we stack allocate the literal, so that the boxing would not
                // try to box trash pointer in the properties.

                // Although object Literal initialization can be done lexically, BailOnNoProfile may cause some path
                // to disappear. Do it is flow base make it easier to stop propagate those entries.

                IR::IntConstOpnd * propertyArrayIdOpnd = instr->GetSrc1()->AsIntConstOpnd();
                const Js::PropertyIdArray * propIds = instr->m_func->GetJITFunctionBody()->ReadPropertyIdArrayFromAuxData(propertyArrayIdOpnd->AsUint32());

                // Duplicates are removed by parser
                Assert(!propIds->hadDuplicates);

                if (globOptData.stackLiteralInitFldDataMap == nullptr)
                {
                    globOptData.stackLiteralInitFldDataMap = JitAnew(alloc, StackLiteralInitFldDataMap, alloc);
                }
                else
                {
                    Assert(!globOptData.stackLiteralInitFldDataMap->ContainsKey(sym));
                }
                StackLiteralInitFldData data = { propIds, 0};
                globOptData.stackLiteralInitFldDataMap->AddNew(sym, data);
            }

            if (globOptData.canStoreTempObjectSyms == nullptr)
            {
                globOptData.canStoreTempObjectSyms = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
            }
            globOptData.canStoreTempObjectSyms->Set(symId);
        }
        else if (globOptData.canStoreTempObjectSyms)
        {
            globOptData.canStoreTempObjectSyms->Clear(symId);
        }
    }
    else
    {
        Assert(!canStoreTemp);
        if (globOptData.maybeTempObjectSyms)
        {
            if (globOptData.canStoreTempObjectSyms)
            {
                globOptData.canStoreTempObjectSyms->Clear(symId);
            }
            globOptData.maybeTempObjectSyms->Clear(symId);
        }
        else
        {
            Assert(!globOptData.canStoreTempObjectSyms);
        }

        // The symbol is being assigned to, the sym shouldn't still be in the stackLiteralInitFldDataMap
        Assert(this->IsLoopPrePass() ||
            globOptData.stackLiteralInitFldDataMap == nullptr
            || globOptData.stackLiteralInitFldDataMap->Count() == 0
            || !globOptData.stackLiteralInitFldDataMap->ContainsKey(sym));
    }
}